

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.h
# Opt level: O0

void __thiscall cmDefinePropertyCommand::~cmDefinePropertyCommand(cmDefinePropertyCommand *this)

{
  cmDefinePropertyCommand *this_local;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmDefinePropertyCommand_00a1f208;
  std::__cxx11::string::~string((string *)&this->FullDocs);
  std::__cxx11::string::~string((string *)&this->BriefDocs);
  std::__cxx11::string::~string((string *)&this->PropertyName);
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmDefinePropertyCommand; }